

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_literals.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_noCompressLiterals(void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  
  uVar2 = (ulong)(((0x1f < srcSize) + 1) - (uint)(srcSize < 0x1000));
  sVar4 = uVar2 + srcSize + 1;
  if (dstCapacity < sVar4) {
    sVar4 = 0xffffffffffffffba;
  }
  else {
    lVar3 = uVar2 + 1;
    iVar1 = (int)lVar3;
    if (iVar1 == 3) {
      *(uint *)dst = (int)srcSize << 4 | 0xc;
    }
    else if (iVar1 == 2) {
      *(ushort *)dst = (ushort)((int)srcSize << 4) | 4;
    }
    else {
      *(char *)dst = (char)srcSize * '\b';
    }
    switchD_0193dc74::default((void *)((long)dst + lVar3),src,srcSize);
  }
  return sVar4;
}

Assistant:

size_t ZSTD_noCompressLiterals (void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    BYTE* const ostart = (BYTE*)dst;
    U32   const flSize = 1 + (srcSize>31) + (srcSize>4095);

    DEBUGLOG(5, "ZSTD_noCompressLiterals: srcSize=%zu, dstCapacity=%zu", srcSize, dstCapacity);

    RETURN_ERROR_IF(srcSize + flSize > dstCapacity, dstSize_tooSmall, "");

    switch(flSize)
    {
        case 1: /* 2 - 1 - 5 */
            ostart[0] = (BYTE)((U32)set_basic + (srcSize<<3));
            break;
        case 2: /* 2 - 2 - 12 */
            MEM_writeLE16(ostart, (U16)((U32)set_basic + (1<<2) + (srcSize<<4)));
            break;
        case 3: /* 2 - 2 - 20 */
            MEM_writeLE32(ostart, (U32)((U32)set_basic + (3<<2) + (srcSize<<4)));
            break;
        default:   /* not necessary : flSize is {1,2,3} */
            assert(0);
    }

    ZSTD_memcpy(ostart + flSize, src, srcSize);
    DEBUGLOG(5, "Raw (uncompressed) literals: %u -> %u", (U32)srcSize, (U32)(srcSize + flSize));
    return srcSize + flSize;
}